

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  size_t sVar1;
  ushort uVar2;
  int iVar3;
  ptls_buffer_t buf;
  uint8_t smallbuf [256];
  
  buf.base = smallbuf;
  buf.off = 0;
  buf.capacity = 0x100;
  buf.is_allocated = 0;
  iVar3 = ptls_buffer__do_pushv(&buf,"",2);
  sVar1 = buf.off;
  if (iVar3 == 0) {
    iVar3 = ptls_buffer__do_pushv(&buf,record_digest,hash->digest_size);
    if (iVar3 == 0) {
      uVar2 = (short)buf.off - (short)sVar1;
      *(ushort *)(buf.base + (sVar1 - 2)) = uVar2 * 0x100 | uVar2 >> 8;
      iVar3 = push_key_share_entry(&buf,group,pubkey);
      if (iVar3 == 0) {
        iVar3 = ptls_buffer__do_pushv(&buf,client_random,0x20);
        if (iVar3 == 0) {
          iVar3 = ptls_calc_hash(hash,digest,buf.base,buf.off);
        }
      }
    }
  }
  ptls_buffer_dispose(&buf);
  return iVar3;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}